

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  TypeID id;
  ID id_00;
  CompilerMSL *pCVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  BuiltIn BVar6;
  ExecutionModel EVar7;
  uint32_t uVar8;
  SPIRType *pSVar9;
  uint7 extraout_var;
  SPIRConstant *pSVar10;
  undefined7 extraout_var_00;
  CompilerError *pCVar11;
  ulong uVar12;
  uint *ts_1;
  uint32_t mbr_idx;
  uint uVar13;
  SPIRVariable *pSVar14;
  ulong uVar15;
  BuiltIn builtin;
  SPIRType *local_270;
  undefined4 local_264;
  uint local_260;
  uint32_t var_mbr_idx;
  CompilerMSL *local_258;
  ulong local_250;
  undefined4 local_244;
  uint local_240;
  uint32_t location;
  string *local_238;
  SPIRType *local_230;
  uint32_t initializer;
  undefined8 local_220;
  InterfaceBlockMeta *local_218;
  SPIRVariable *local_210;
  undefined4 local_204;
  string mbr_name_qual;
  uint32_t var_id;
  uint32_t ptr_type_id;
  SmallVector<unsigned_int,_8UL> *local_198;
  ParsedIR *local_190;
  SPIRFunction *local_188;
  SPIRType ptr_type;
  
  pSVar14 = var;
  local_238 = ib_var_ref;
  local_230 = ib_type;
  local_188 = Compiler::get<spirv_cross::SPIRFunction>
                        ((Compiler *)this,
                         (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  if (meta->strip_array == true) {
    pSVar9 = Compiler::get_variable_element_type((Compiler *)this,var);
  }
  else {
    pSVar9 = Compiler::get_variable_data_type((Compiler *)this,var);
  }
  bVar2 = Compiler::is_builtin_variable((Compiler *)this,var);
  BVar6 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  builtin = BVar6;
  local_270 = pSVar9;
  bVar3 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,DecorationBlock);
  if (storage == StorageClassOutput) {
    bVar4 = CompilerGLSL::is_stage_output_variable_masked(&this->super_CompilerGLSL,var);
    if (bVar4) {
      emit_local_masked_variable(this,var,meta->strip_array);
      return;
    }
LAB_002ebca1:
    local_264 = 0;
  }
  else {
    if (storage != StorageClassInput) goto LAB_002ebca1;
    bVar4 = Compiler::has_decoration
                      ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationPerVertexKHR);
    local_264 = (undefined4)CONCAT71((int7)((ulong)ib_type >> 8),1);
    if (bVar4) {
      pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&ptr_type,"PerVertexKHR decoration is not supported in MSL.",
                 (allocator *)&mbr_name_qual);
      CompilerError::CompilerError(pCVar11,(string *)&ptr_type);
      __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,(var->super_IVariant).self.id);
  local_258 = this;
  if (*(int *)&(local_270->super_IVariant).field_0xc == 0xf) {
    bVar4 = variable_storage_requires_stage_io(this,storage);
    if ((!bVar4) && (bVar3)) {
      bVar4 = (local_270->array).super_VectorView<unsigned_int>.buffer_size == 0;
    }
    local_204 = (undefined4)CONCAT71(extraout_var & 0xffffff,1);
    if ((!bVar2 && bVar4 == true) && (meta->allow_local_declaration == true)) {
      emit_local_masked_variable(this,var,meta->strip_array);
      local_204 = 0;
    }
    pSVar9 = local_270;
    if (bVar4 == false) {
LAB_002ebe71:
      add_plain_variable_to_interface_block(this,storage,local_238,local_230,var,meta);
      return;
    }
    location = 0xffffffff;
    var_mbr_idx = 0;
    bVar2 = Compiler::is_matrix((Compiler *)this,local_270);
    bVar4 = Compiler::is_array((Compiler *)this,pSVar9);
    if (bVar2) {
      if (bVar4) {
        pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&ptr_type,
                   "MSL cannot emit arrays-of-matrices in input and output variables.",
                   (allocator *)&mbr_name_qual);
        CompilerError::CompilerError(pCVar11,(string *)&ptr_type);
        __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_260 = local_270->columns;
    }
    else if (bVar4) {
      if ((local_270->array).super_VectorView<unsigned_int>.buffer_size != 1) {
        pCVar11 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&ptr_type,
                   "MSL cannot emit arrays-of-arrays in input and output variables.",
                   (allocator *)&mbr_name_qual);
        CompilerError::CompilerError(pCVar11,(string *)&ptr_type);
        __cxa_throw(pCVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      local_260 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,local_270);
    }
    else {
      local_260 = 1;
    }
    local_190 = &(this->super_CompilerGLSL).super_Compiler.ir;
    local_198 = &this->vars_needing_early_declaration;
    local_220 = 0;
    uVar12 = 0;
    local_218 = meta;
    local_210 = var;
    for (local_240 = 0; local_240 < local_260; local_240 = local_240 + 1) {
      local_250 = uVar12;
      for (uVar15 = 0; pSVar9 = local_270,
          uVar15 < (uint)(local_270->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
          uVar15 = uVar15 + 1) {
        builtin = BuiltInMax;
        uVar8 = (uint32_t)uVar15;
        bVar2 = Compiler::is_member_builtin((Compiler *)this,local_270,uVar8,&builtin);
        pSVar9 = Compiler::get<spirv_cross::SPIRType>
                           ((Compiler *)this,
                            (pSVar9->member_types).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                            [uVar15].id);
        if ((storage == StorageClassOutput) &&
           (bVar4 = CompilerGLSL::is_stage_output_block_member_masked
                              (&this->super_CompilerGLSL,var,uVar8,meta->strip_array), bVar4)) {
          location = 0xffffffff;
          local_220._0_1_ = (byte)local_220 | bVar3;
          if ((bVar2) && (meta->strip_array == false)) {
            ptr_type_id = ParsedIR::increase_bound_by(local_190,2);
            var_id = ptr_type_id + 1;
            SPIRType::SPIRType(&ptr_type,pSVar9);
            ptr_type.pointer = true;
            ptr_type.pointer_depth = ptr_type.pointer_depth + 1;
            ptr_type.parent_type.id =
                 (local_270->member_types).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[uVar15].id;
            initializer = 0;
            ptr_type.storage = StorageClassOutput;
            uVar8 = (var->initializer).id;
            if ((uVar8 != 0) &&
               (pSVar10 = Compiler::maybe_get<spirv_cross::SPIRConstant>((Compiler *)this,uVar8),
               pSVar10 != (SPIRConstant *)0x0)) {
              initializer = (pSVar10->subconstants).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                            [uVar15].id;
            }
            Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                      ((Compiler *)this,ptr_type_id,&ptr_type);
            mbr_name_qual._M_dataplus._M_p._0_4_ = 3;
            pSVar14 = (SPIRVariable *)&initializer;
            Compiler::set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,unsigned_int&>
                      ((Compiler *)this,var_id,&ptr_type_id,(StorageClass *)&mbr_name_qual,
                       (uint *)pSVar14);
            SPIRFunction::add_local_variable(local_188,(VariableID)var_id);
            SmallVector<unsigned_int,_8UL>::push_back(local_198,&var_id);
            uVar8 = var_id;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                      (&mbr_name_qual,this,(ulong)builtin,3);
            Compiler::set_name((Compiler *)this,(ID)uVar8,&mbr_name_qual);
            ::std::__cxx11::string::~string((string *)&mbr_name_qual);
            Compiler::set_decoration((Compiler *)this,(ID)var_id,DecorationBuiltIn,builtin);
            SPIRType::~SPIRType(&ptr_type);
          }
LAB_002ec164:
          uVar8 = (uint32_t)local_250;
        }
        else {
          if ((bVar2) &&
             (bVar4 = Compiler::has_active_builtin((Compiler *)this,builtin,storage), !bVar4))
          goto LAB_002ec164;
          bVar4 = Compiler::is_matrix((Compiler *)this,pSVar9);
          if ((bVar4) || (bVar4 = Compiler::is_array((Compiler *)this,pSVar9), bVar4)) {
            local_244 = 0;
          }
          else {
            local_244 = (undefined4)
                        CONCAT71(extraout_var_00,*(int *)&(pSVar9->super_IVariant).field_0xc != 0xf)
            ;
          }
          bVar4 = true;
          if ((byte)local_264 != '\0') {
            EVar7 = Compiler::get_execution_model((Compiler *)local_258);
            bVar4 = EVar7 == ExecutionModelFragment;
          }
          pCVar1 = local_258;
          bVar5 = variable_storage_requires_stage_io(local_258,storage);
          BVar6 = builtin;
          ts_1 = (uint *)0x1;
          (*(pCVar1->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (&ptr_type,pCVar1,(ulong)(local_210->super_IVariant).self.id);
          ::std::__cxx11::string::string((string *)&mbr_name_qual,(string *)&ptr_type);
          ::std::__cxx11::string::string((string *)&ptr_type_id,(string *)&ptr_type);
          pSVar9 = local_270;
          if (1 < local_260) {
            join<char_const(&)[2],unsigned_int&>
                      ((string *)&var_id,(spirv_cross *)0x3835c0,(char (*) [2])&local_240,ts_1);
            ::std::__cxx11::string::append((string *)&mbr_name_qual);
            ::std::__cxx11::string::~string((string *)&var_id);
            join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                      ((string *)&var_id,(spirv_cross *)0x37d448,(char (*) [2])&local_240,
                       (uint *)0x3759d6,(char (*) [2])pSVar14);
            ::std::__cxx11::string::append((string *)&ptr_type_id);
            ::std::__cxx11::string::~string((string *)&var_id);
          }
          var = local_210;
          meta = local_218;
          pSVar14 = local_210;
          if (((~bVar5 | (byte)local_244) & 1) == 0 &&
              (bVar2 & bVar4 & BVar6 - BuiltInVertexId < 0xfffffffe) == 0) {
            add_composite_member_variable_to_interface_block
                      (local_258,storage,local_238,local_230,local_210,pSVar9,uVar8,local_218,
                       &mbr_name_qual,(string *)&ptr_type_id,&location,&var_mbr_idx);
            uVar8 = var_mbr_idx;
          }
          else {
            add_plain_member_variable_to_interface_block
                      (local_258,storage,local_238,local_230,local_210,pSVar9,uVar8,local_218,
                       &mbr_name_qual,(string *)&ptr_type_id,&location,&var_mbr_idx);
            uVar8 = (uint32_t)local_250;
          }
          ::std::__cxx11::string::~string((string *)&ptr_type_id);
          ::std::__cxx11::string::~string((string *)&mbr_name_qual);
          ::std::__cxx11::string::~string((string *)&ptr_type);
          this = local_258;
        }
        var_mbr_idx = uVar8 + 1;
        local_250 = (ulong)var_mbr_idx;
      }
      uVar12 = local_250;
    }
    if ((((byte)local_204 & (byte)local_220) != 0) &&
       ((bVar2 = Compiler::is_builtin_variable((Compiler *)this,var), !bVar2 ||
        (bVar2 = is_tesc_shader(this), bVar2)))) {
      bVar2 = Compiler::is_builtin_variable((Compiler *)this,var);
      if (bVar2) {
        for (uVar13 = 0; id.id = (local_270->super_IVariant).self.id,
            uVar13 < (uint)(local_270->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size; uVar13 = uVar13 + 1) {
          uVar8 = Compiler::get_member_decoration((Compiler *)this,id,uVar13,DecorationBuiltIn);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                    (&ptr_type,this,(ulong)uVar8,3);
          Compiler::set_member_name((Compiler *)this,id,uVar13,(string *)&ptr_type);
          ::std::__cxx11::string::~string((string *)&ptr_type);
        }
        ::std::__cxx11::string::string
                  ((string *)&ptr_type,"gl_PerVertex",(allocator *)&mbr_name_qual);
        Compiler::set_name((Compiler *)this,(ID)id.id,(string *)&ptr_type);
        meta = local_218;
        ::std::__cxx11::string::~string((string *)&ptr_type);
        id_00.id = (var->super_IVariant).self.id;
        ::std::__cxx11::string::string
                  ((string *)&ptr_type,"gl_out_masked",(allocator *)&mbr_name_qual);
        Compiler::set_name((Compiler *)this,id_00,(string *)&ptr_type);
        ::std::__cxx11::string::~string((string *)&ptr_type);
        (this->stage_out_masked_builtin_type_id).id = (local_270->super_IVariant).self.id;
      }
      emit_local_masked_variable(this,var,meta->strip_array);
    }
  }
  else {
    bVar3 = is_tese_shader(this);
    if (((bVar3 & (byte)local_264) == 1) &&
       ((~meta->strip_array & bVar2 & BVar6 - BuiltInTessLevelOuter < 2) == 1)) {
      add_tess_level_input_to_interface_block(this,local_238,local_230,var);
      return;
    }
    uVar13 = *(uint *)&(local_270->super_IVariant).field_0xc;
    if (((uVar13 < 0x18) && ((0x8077fcU >> (uVar13 & 0x1f) & 1) != 0)) &&
       ((!bVar2 || (bVar3 = Compiler::has_active_builtin((Compiler *)this,BVar6,storage), bVar3))))
    {
      pSVar9 = local_270;
      bVar3 = Compiler::is_matrix((Compiler *)this,local_270);
      if (bVar3) {
        bVar3 = false;
      }
      else {
        bVar3 = Compiler::is_array((Compiler *)this,pSVar9);
        bVar3 = !bVar3;
      }
      bVar4 = variable_storage_requires_stage_io(this,storage);
      bVar5 = true;
      if ((byte)local_264 != '\0') {
        EVar7 = Compiler::get_execution_model((Compiler *)local_258);
        bVar5 = EVar7 == ExecutionModelFragment;
      }
      this = local_258;
      if ((!bVar3 && bVar4) && (bVar2 & bVar5 & BVar6 - BuiltInVertexId < 0xfffffffe) == 0) {
        add_composite_variable_to_interface_block(local_258,storage,local_238,local_230,var,meta);
        return;
      }
      goto LAB_002ebe71;
    }
  }
  return;
}

Assistant:

void CompilerMSL::add_variable_to_interface_block(StorageClass storage, const string &ib_var_ref, SPIRType &ib_type,
                                                  SPIRVariable &var, InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	// Tessellation control I/O variables and tessellation evaluation per-point inputs are
	// usually declared as arrays. In these cases, we want to add the element type to the
	// interface block, since in Metal it's the interface block itself which is arrayed.
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	bool is_builtin = is_builtin_variable(var);
	auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_block = has_decoration(var_type.self, DecorationBlock);

	// If stage variables are masked out, emit them as plain variables instead.
	// For builtins, we query them one by one later.
	// IO blocks are not masked here, we need to mask them per-member instead.
	if (storage == StorageClassOutput && is_stage_output_variable_masked(var))
	{
		// If we ignore an output, we must still emit it, since it might be used by app.
		// Instead, just emit it as early declaration.
		emit_local_masked_variable(var, meta.strip_array);
		return;
	}

	if (storage == StorageClassInput && has_decoration(var.self, DecorationPerVertexKHR))
		SPIRV_CROSS_THROW("PerVertexKHR decoration is not supported in MSL.");

	// If variable names alias, they will end up with wrong names in the interface struct, because
	// there might be aliases in the member name cache and there would be a mismatch in fixup_in code.
	// Make sure to register the variables as unique resource names ahead of time.
	// This would normally conflict with the name cache when emitting local variables,
	// but this happens in the setup stage, before we hit compilation loops.
	// The name cache is cleared before we actually emit code, so this is safe.
	add_resource_name(var.self);

	if (var_type.basetype == SPIRType::Struct)
	{
		bool block_requires_flattening =
		    variable_storage_requires_stage_io(storage) || (is_block && var_type.array.empty());
		bool needs_local_declaration = !is_builtin && block_requires_flattening && meta.allow_local_declaration;

		if (needs_local_declaration)
		{
			// For I/O blocks or structs, we will need to pass the block itself around
			// to functions if they are used globally in leaf functions.
			// Rather than passing down member by member,
			// we unflatten I/O blocks while running the shader,
			// and pass the actual struct type down to leaf functions.
			// We then unflatten inputs, and flatten outputs in the "fixup" stages.
			emit_local_masked_variable(var, meta.strip_array);
		}

		if (!block_requires_flattening)
		{
			// In Metal tessellation shaders, the interface block itself is arrayed. This makes things
			// very complicated, since stage-in structures in MSL don't support nested structures.
			// Luckily, for stage-out when capturing output, we can avoid this and just add
			// composite members directly, because the stage-out structure is stored to a buffer,
			// not returned.
			add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
		}
		else
		{
			bool masked_block = false;
			uint32_t location = UINT32_MAX;
			uint32_t var_mbr_idx = 0;
			uint32_t elem_cnt = 1;
			if (is_matrix(var_type))
			{
				if (is_array(var_type))
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

				elem_cnt = var_type.columns;
			}
			else if (is_array(var_type))
			{
				if (var_type.array.size() != 1)
					SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

				elem_cnt = to_array_size_literal(var_type);
			}

			for (uint32_t elem_idx = 0; elem_idx < elem_cnt; elem_idx++)
			{
				// Flatten the struct members into the interface struct
				for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
				{
					builtin = BuiltInMax;
					is_builtin = is_member_builtin(var_type, mbr_idx, &builtin);
					auto &mbr_type = get<SPIRType>(var_type.member_types[mbr_idx]);

					if (storage == StorageClassOutput && is_stage_output_block_member_masked(var, mbr_idx, meta.strip_array))
					{
						location = UINT32_MAX; // Skip this member and resolve location again on next var member

						if (is_block)
							masked_block = true;

						// Non-builtin block output variables are just ignored, since they will still access
						// the block variable as-is. They're just not flattened.
						if (is_builtin && !meta.strip_array)
						{
							// Emit a fake variable instead.
							uint32_t ids = ir.increase_bound_by(2);
							uint32_t ptr_type_id = ids + 0;
							uint32_t var_id = ids + 1;

							auto ptr_type = mbr_type;
							ptr_type.pointer = true;
							ptr_type.pointer_depth++;
							ptr_type.parent_type = var_type.member_types[mbr_idx];
							ptr_type.storage = StorageClassOutput;

							uint32_t initializer = 0;
							if (var.initializer)
								if (auto *c = maybe_get<SPIRConstant>(var.initializer))
									initializer = c->subconstants[mbr_idx];

							set<SPIRType>(ptr_type_id, ptr_type);
							set<SPIRVariable>(var_id, ptr_type_id, StorageClassOutput, initializer);
							entry_func.add_local_variable(var_id);
							vars_needing_early_declaration.push_back(var_id);
							set_name(var_id, builtin_to_glsl(builtin, StorageClassOutput));
							set_decoration(var_id, DecorationBuiltIn, builtin);
						}
					}
					else if (!is_builtin || has_active_builtin(builtin, storage))
					{
						bool is_composite_type = is_matrix(mbr_type) || is_array(mbr_type) || mbr_type.basetype == SPIRType::Struct;
						bool attribute_load_store =
								storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;
						bool storage_is_stage_io = variable_storage_requires_stage_io(storage);

						// Clip/CullDistance always need to be declared as user attributes.
						if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
							is_builtin = false;

						const string var_name = to_name(var.self);
						string mbr_name_qual = var_name;
						string var_chain_qual = var_name;
						if (elem_cnt > 1)
						{
							mbr_name_qual += join("_", elem_idx);
							var_chain_qual += join("[", elem_idx, "]");
						}

						if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
						{
							add_composite_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                                 var, var_type, mbr_idx, meta,
							                                                 mbr_name_qual, var_chain_qual,
							                                                 location, var_mbr_idx);
						}
						else
						{
							add_plain_member_variable_to_interface_block(storage, ib_var_ref, ib_type,
							                                             var, var_type, mbr_idx, meta,
							                                             mbr_name_qual, var_chain_qual,
							                                             location, var_mbr_idx);
						}
					}
					var_mbr_idx++;
				}
			}

			// If we're redirecting a block, we might still need to access the original block
			// variable if we're masking some members.
			if (masked_block && !needs_local_declaration && (!is_builtin_variable(var) || is_tesc_shader()))
			{
				if (is_builtin_variable(var))
				{
					// Ensure correct names for the block members if we're actually going to
					// declare gl_PerVertex.
					for (uint32_t mbr_idx = 0; mbr_idx < uint32_t(var_type.member_types.size()); mbr_idx++)
					{
						set_member_name(var_type.self, mbr_idx, builtin_to_glsl(
								BuiltIn(get_member_decoration(var_type.self, mbr_idx, DecorationBuiltIn)),
								StorageClassOutput));
					}

					set_name(var_type.self, "gl_PerVertex");
					set_name(var.self, "gl_out_masked");
					stage_out_masked_builtin_type_id = var_type.self;
				}
				emit_local_masked_variable(var, meta.strip_array);
			}
		}
	}
	else if (is_tese_shader() && storage == StorageClassInput && !meta.strip_array && is_builtin &&
	         (builtin == BuiltInTessLevelOuter || builtin == BuiltInTessLevelInner))
	{
		add_tess_level_input_to_interface_block(ib_var_ref, ib_type, var);
	}
	else if (var_type.basetype == SPIRType::Boolean || var_type.basetype == SPIRType::Char ||
	         type_is_integral(var_type) || type_is_floating_point(var_type))
	{
		if (!is_builtin || has_active_builtin(builtin, storage))
		{
			bool is_composite_type = is_matrix(var_type) || is_array(var_type);
			bool storage_is_stage_io = variable_storage_requires_stage_io(storage);
			bool attribute_load_store = storage == StorageClassInput && get_execution_model() != ExecutionModelFragment;

			// Clip/CullDistance always needs to be declared as user attributes.
			if (builtin == BuiltInClipDistance || builtin == BuiltInCullDistance)
				is_builtin = false;

			// MSL does not allow matrices or arrays in input or output variables, so need to handle it specially.
			if ((!is_builtin || attribute_load_store) && storage_is_stage_io && is_composite_type)
			{
				add_composite_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
			else
			{
				add_plain_variable_to_interface_block(storage, ib_var_ref, ib_type, var, meta);
			}
		}
	}
}